

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  uint uVar1;
  uint *puVar2;
  uint local_1c;
  ImGuiContext *pIStack_18;
  ImGuiItemFlags item_flags;
  ImGuiContext *g;
  bool enabled_local;
  ImGuiItemFlags option_local;
  
  pIStack_18 = GImGui;
  uVar1 = GImGui->CurrentItemFlags;
  local_1c = uVar1;
  g._3_1_ = enabled;
  g._4_4_ = option;
  puVar2 = (uint *)ImVector<int>::back(&GImGui->ItemFlagsStack);
  if (uVar1 == *puVar2) {
    if ((g._3_1_ & 1) == 0) {
      local_1c = (g._4_4_ ^ 0xffffffff) & local_1c;
    }
    else {
      local_1c = g._4_4_ | local_1c;
    }
    pIStack_18->CurrentItemFlags = local_1c;
    ImVector<int>::push_back(&pIStack_18->ItemFlagsStack,(int *)&local_1c);
    return;
  }
  __assert_fail("item_flags == g.ItemFlagsStack.back()",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x1ab8,"void ImGui::PushItemFlag(ImGuiItemFlags, bool)");
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}